

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall Memory::Recycler::ResetCollectionState(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  size_t sVar4;
  
  bVar2 = IsMarkStackEmpty(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x903,"(IsMarkStackEmpty())","IsMarkStackEmpty()");
    if (!bVar2) goto LAB_0067f603;
    *puVar3 = 0;
  }
  ObservableValue<Memory::CollectionState>::SetValue
            (&this->collectionState,CollectionStateNotCollecting);
  this->backgroundFinishMarkCount = '\0';
  this->inExhaustiveCollection = false;
  this->inDecommitNowCollection = false;
  CleanupPendingUnroot(this);
  if (this->inPartialCollectMode == true) {
    FinishPartialCollect(this,(RecyclerSweepManager *)0x0);
  }
  bVar2 = DoQueueTrackedObject(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x917,"(!this->DoQueueTrackedObject())","!this->DoQueueTrackedObject()");
    if (!bVar2) {
LAB_0067f603:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  sVar4 = HeapInfoManager::GetFinalizeCount(&this->autoHeap);
  (this->collectionStats).finalizeCount = sVar4;
  return;
}

Assistant:

void
Recycler::ResetCollectionState()
{
    Assert(IsMarkStackEmpty());

    this->SetCollectionState(CollectionStateNotCollecting);
#if ENABLE_CONCURRENT_GC
    this->backgroundFinishMarkCount = 0;
#endif
    this->inExhaustiveCollection = false;
    this->inDecommitNowCollection = false;

#if ENABLE_CONCURRENT_GC
    CleanupPendingUnroot();
#endif

#if ENABLE_PARTIAL_GC
    if (inPartialCollectMode)
    {
        FinishPartialCollect();
    }
#endif
#if ENABLE_CONCURRENT_GC
    Assert(!this->DoQueueTrackedObject());
#endif
#ifdef RECYCLER_FINALIZE_CHECK
    // Reset the collection stats.
    this->collectionStats.finalizeCount = this->autoHeap.GetFinalizeCount();
#endif
}